

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydbalance.cpp
# Opt level: O1

double __thiscall
HydBalance::evaluate(HydBalance *this,double lamda,double *dH,double *dQ,double *xQ,Network *nw)

{
  double dVar1;
  double dVar2;
  int iVar3;
  
  this->maxFlowErr = 0.0;
  this->maxHeadErr = 0.0;
  this->maxFlowChange = 0.0;
  this->maxHeadErrLink = -1;
  this->maxFlowErrNode = -1;
  this->maxFlowChangeLink = -1;
  iVar3 = Network::count(nw,NODE);
  memset(xQ,0,(long)iVar3 << 3);
  dVar1 = findHeadErrorNorm(this,lamda,dH,dQ,xQ,nw);
  findNodeOutflows(lamda,dH,xQ,nw);
  dVar2 = findFlowErrorNorm(this,xQ,nw);
  dVar2 = dVar2 + dVar1;
  dVar1 = findTotalFlowChange(lamda,dQ,nw);
  this->totalFlowChange = dVar1;
  if (0.0 <= dVar2) {
    return SQRT(dVar2);
  }
  dVar1 = sqrt(dVar2);
  return dVar1;
}

Assistant:

double  HydBalance::evaluate(
            double lamda,  // step size
            double dH[],   // change in nodal heads
            double dQ[],   // change in link flows
            double xQ[],   // nodal inflow minus outflow
            Network* nw)   // network being analyzed
{
    // ... initialize which elements have the maximum errors
    maxFlowErr = 0.0;
    maxHeadErr = 0.0;
    maxFlowChange = 0.0;
    maxHeadErrLink = -1;
    maxFlowErrNode = -1;
    maxFlowChangeLink = -1;

    // ... initialize nodal flow imbalances to 0

    int nodeCount = nw->count(Element::NODE);
    memset(&xQ[0], 0, nodeCount*sizeof(double));

    // ... find the error norm in satisfying conservation of energy
    //     (updating xQ with internal link flows)

    double norm = findHeadErrorNorm(lamda, dH, dQ, xQ, nw);

    // ... update xQ with external outflows

    findNodeOutflows(lamda, dH, xQ, nw);

    // ... add the error norm in satisfying conservation of flow

    norm += findFlowErrorNorm(xQ, nw);

    // ... evaluate the total relative flow change

    totalFlowChange = findTotalFlowChange(lamda, dQ, nw);

    // ... return the root mean square error

    return sqrt(norm);
}